

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O3

bool __thiscall DropdownMenu::update(DropdownMenu *this,int mouseX,int mouseY,bool clicked)

{
  Transformable *this_00;
  pointer pTVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  Vector2f *pVVar5;
  uint uVar6;
  uint mouseX_00;
  TextButton *b;
  pointer pTVar7;
  uint mouseY_00;
  
  uVar6 = (uint)clicked;
  this_00 = &(this->super_UIComponent).super_Transformable;
  pVVar5 = sf::Transformable::getPosition(this_00);
  mouseX_00 = mouseX - (int)pVVar5->x;
  pVVar5 = sf::Transformable::getPosition(this_00);
  mouseY_00 = mouseY - (int)pVVar5->y;
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    pTVar7 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl
             .super__Vector_impl_data._M_start;
    pTVar1 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (pTVar7 != pTVar1) {
      bVar3 = 0;
      do {
        iVar4 = (*(pTVar7->super_UIComponent).super_Drawable._vptr_Drawable[3])
                          (pTVar7,(ulong)mouseX_00,(ulong)mouseY_00,(ulong)(uVar6 & 1));
        if ((pTVar7->selected & bVar3) == 1) {
          sf::Shape::setFillColor(&(pTVar7->button).super_Shape,&pTVar7->color1);
          pTVar7->selected = false;
          bVar3 = 1;
        }
        else {
          bVar3 = bVar3 | pTVar7->selected;
        }
        uVar6 = (uint)(byte)((byte)uVar6 & ((byte)iVar4 ^ 1));
        pTVar7 = pTVar7 + 1;
      } while (pTVar7 != pTVar1);
    }
  }
  bVar2 = TextButton::update(&this->button,mouseX_00,mouseY_00,clicked);
  if (bVar2) {
    bVar3 = (this->super_UIComponent).super_Transformable.field_0xa9 ^ 1;
  }
  else {
    if (!clicked) {
      return false;
    }
    bVar3 = 0;
  }
  (this->super_UIComponent).super_Transformable.field_0xa9 = bVar3;
  return false;
}

Assistant:

bool DropdownMenu::update(int mouseX, int mouseY, bool clicked) {
    mouseX -= static_cast<int>(getPosition().x);
    mouseY -= static_cast<int>(getPosition().y);
    if (visible) {
        bool clickDone = clicked, buttonSelected = false;
        for (TextButton& b : menuButtons) {
            if (b.update(mouseX, mouseY, clickDone)) {    // Only one button in the menu can be pressed.
                clickDone = false;
            }
            if (b.selected && !buttonSelected) {
                buttonSelected = true;
            } else if (b.selected) {
                b.button.setFillColor(b.color1);
                b.selected = false;
            }
        }
    }
    if (button.update(mouseX, mouseY, clicked)) {
        visible = !visible;
    } else if (clicked) {
        visible = false;
    }
    return false;
}